

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cxx
# Opt level: O1

void write_word(char *w)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  int iVar6;
  char *pcVar7;
  
  if (needspace != 0) {
    putc(0x20,(FILE *)fout);
  }
  needspace = 1;
  if ((w == (char *)0x0) || (pcVar5 = w, *w == '\0')) {
    fwrite("{}",2,1,(FILE *)fout);
    return;
  }
  do {
    pcVar7 = pcVar5;
    iVar4 = is_id(*pcVar7);
    pcVar5 = pcVar7 + 1;
  } while (iVar4 != 0);
  if (*pcVar7 == '\0') {
    fputs(w,(FILE *)fout);
    return;
  }
  iVar4 = 0;
  pcVar5 = w;
  do {
    cVar1 = *pcVar5;
    if (cVar1 == '{') {
      iVar4 = iVar4 + 1;
    }
    else if (cVar1 == '}') {
      iVar6 = iVar4 + -1;
      bVar3 = iVar4 < 1;
      iVar4 = iVar6;
      if (bVar3) break;
    }
    else if (cVar1 == '\0') break;
    pcVar5 = pcVar5 + 1;
  } while( true );
  putc(0x7b,(FILE *)fout);
  do {
    bVar2 = *w;
    if (bVar2 < 0x7b) {
      if ((bVar2 == 0x23) || (bVar2 == 0x5c)) {
LAB_00197d55:
        putc(0x5c,(FILE *)fout);
      }
      else if (bVar2 == 0) {
        putc(0x7d,(FILE *)fout);
        return;
      }
    }
    else if (((bVar2 == 0x7d) || (bVar2 == 0x7b)) && (iVar4 != 0)) goto LAB_00197d55;
    putc((int)*w,(FILE *)fout);
    w = (char *)((byte *)w + 1);
  } while( true );
}

Assistant:

void write_word(const char *w) {
  if (needspace) putc(' ', fout);
  needspace = 1;
  if (!w || !*w) {fprintf(fout,"{}"); return;}
  const char *p;
  // see if it is a single word:
  for (p = w; is_id(*p); p++) ;
  if (!*p) {fprintf(fout,"%s",w); return;}
  // see if there are matching braces:
  int n = 0;
  for (p = w; *p; p++) {
    if (*p == '{') n++;
    else if (*p == '}') {n--; if (n<0) break;}
  }
  int mismatched = (n != 0);
  // write out brace-quoted string:
  putc('{', fout);
  for (; *w; w++) {
    switch (*w) {
    case '{':
    case '}':
      if (!mismatched) break;
    case '\\':
    case '#':
      putc('\\',fout);
      break;
    }
    putc(*w,fout);
  }
  putc('}', fout);
}